

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::findMSBCaseInstance::compare
          (findMSBCaseInstance *this,void **inputs,void **outputs)

{
  char cVar1;
  DataType dataType;
  uint uVar2;
  int iVar3;
  pointer pSVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ostream *poVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  
  pSVar4 = (this->super_IntegerFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar4->varType).m_data.basic.type;
  uVar2 = *(uint *)((long)&(pSVar4->varType).m_data + 4);
  uVar5 = glu::getDataTypeScalarSize(dataType);
  cVar1 = (&DAT_009f53e8)[(ulong)uVar2 * 4];
  uVar13 = 0;
  uVar12 = 0;
  if (0 < (int)uVar5) {
    uVar12 = (ulong)uVar5;
  }
  do {
    if (uVar12 == uVar13) {
LAB_007aa413:
      return (long)(int)uVar5 <= (long)uVar13;
    }
    uVar2 = *(uint *)((long)*inputs + uVar13 * 4);
    uVar6 = uVar2 & (2 << (cVar1 - 1U & 0x1f)) - 1U;
    iVar3 = *(int *)((long)*outputs + uVar13 * 4);
    if (dataType - TYPE_INT < 4) {
      iVar7 = shaderexecutor::anon_unknown_0::findMSB
                        ((uVar6 & 1 << (cVar1 - 1U & 0x1f)) * -2 | uVar6);
      iVar8 = shaderexecutor::anon_unknown_0::findMSB(uVar2);
    }
    else {
      uVar9 = 0x20;
      uVar11 = uVar9;
      if (uVar6 != 0) {
        uVar11 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> uVar11 == 0; uVar11 = uVar11 - 1) {
          }
        }
        uVar11 = uVar11 ^ 0x1f;
      }
      if (uVar2 != 0) {
        uVar9 = 0x1f;
        if (uVar2 != 0) {
          for (; uVar2 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar9 = uVar9 ^ 0x1f;
      }
      iVar7 = 0x1f - uVar11;
      iVar8 = 0x1f - uVar9;
    }
    if ((iVar3 < iVar7) || (iVar8 < iVar3)) {
      poVar10 = std::operator<<((ostream *)&(this->super_IntegerFunctionTestInstance).m_failMsg,
                                "Expected [");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)uVar13);
      poVar10 = std::operator<<(poVar10,"] in range [");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar8);
      std::operator<<(poVar10,"]");
      goto LAB_007aa413;
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				isSigned		= glu::isDataTypeIntOrIVec(type);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const int		out		= ((const deInt32*)outputs[0])[compNdx];
			const int		minRef	= isSigned ? findMSB(toPrecision(deInt32(value), integerLength))	: findMSB(toPrecision(value, integerLength));
			const int		maxRef	= isSigned ? findMSB(deInt32(value))								: findMSB(value);

			if (!de::inRange(out, minRef, maxRef))
			{
				m_failMsg << "Expected [" << compNdx << "] in range [" << minRef << ", " << maxRef << "]";
				return false;
			}
		}

		return true;
	}